

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUITabControl * __thiscall
irr::gui::CGUIEnvironment::addTabControl
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,bool fillbackground,
          bool border,s32 id)

{
  IGUITabControl *pIVar1;
  undefined4 in_R9D;
  IGUITabControl *t;
  bool in_stack_00000056;
  bool in_stack_00000057;
  rect<int> *in_stack_00000058;
  IGUIElement *in_stack_00000060;
  IGUIEnvironment *in_stack_00000068;
  CGUITabControl *in_stack_00000070;
  s32 in_stack_00000080;
  undefined4 in_stack_ffffffffffffffbc;
  
  pIVar1 = (IGUITabControl *)operator_new(0x1a0);
  CGUITabControl::CGUITabControl
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
             in_stack_00000057,in_stack_00000056,in_stack_00000080);
  IReferenceCounted::drop((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffbc,in_R9D));
  return pIVar1;
}

Assistant:

IGUITabControl *CGUIEnvironment::addTabControl(const core::rect<s32> &rectangle,
		IGUIElement *parent, bool fillbackground, bool border, s32 id)
{
	IGUITabControl *t = new CGUITabControl(this, parent ? parent : this,
			rectangle, fillbackground, border, id);
	t->drop();
	return t;
}